

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

lyd_node *
resolve_partial_json_data_nodeid
          (char *nodeid,char *llist_value,lyd_node *start,int options,int *parsed)

{
  ly_ctx *ctx_00;
  lyd_node *plVar1;
  char *__s2;
  int iVar2;
  lys_node *plVar3;
  LY_ERR *pLVar4;
  uint8_t *puVar5;
  lys_module *plVar6;
  size_t sVar7;
  ly_ctx *ctx;
  lys_module *prev_mod;
  lys_module *prefix_mod;
  lyd_node_leaf_list *llist;
  lyd_node *last_match;
  lyd_node *sibling;
  int local_a0;
  int last_has_pred;
  int pred_name_len;
  int llval_len;
  int last_parsed;
  int has_predicate;
  int list_instance_position;
  int is_relative;
  int nam_len;
  int mod_name_len;
  int ret;
  int r;
  char *data_val;
  char *pred_name;
  char *name;
  char *mod_name;
  char *id;
  char *str;
  char *buf_backup;
  char *module_name;
  int *parsed_local;
  lyd_node *plStack_28;
  int options_local;
  lyd_node *start_local;
  char *llist_value_local;
  char *nodeid_local;
  
  module_name = (char *)parsed;
  parsed_local._4_4_ = options;
  plStack_28 = start;
  start_local = (lyd_node *)llist_value;
  llist_value_local = nodeid;
  buf_backup = ly_buf();
  str = (char *)0x0;
  has_predicate = -1;
  llist = (lyd_node_leaf_list *)0x0;
  if (((llist_value_local == (char *)0x0) || (plStack_28 == (lyd_node *)0x0)) ||
     (module_name == (char *)0x0)) {
    __assert_fail("nodeid && start && parsed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x8f8,
                  "struct lyd_node *resolve_partial_json_data_nodeid(const char *, const char *, struct lyd_node *, int, int *)"
                 );
  }
  ctx_00 = plStack_28->schema->module->ctx;
  mod_name = llist_value_local;
  pred_name_len =
       parse_schema_nodeid(llist_value_local,&name,&is_relative,&pred_name,&list_instance_position,
                           &has_predicate,&llval_len);
  mod_name_len = pred_name_len;
  if (pred_name_len < 1) {
    ly_vlog(LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,(ulong)(uint)(int)mod_name[-pred_name_len],
            mod_name + -pred_name_len);
    module_name[0] = -1;
    module_name[1] = -1;
    module_name[2] = -1;
    module_name[3] = -1;
    return (lyd_node *)0x0;
  }
  mod_name = mod_name + pred_name_len;
  if (has_predicate == 0) {
    for (; plStack_28->parent != (lyd_node *)0x0; plStack_28 = plStack_28->parent) {
    }
    ctx = (ly_ctx *)lyd_node_module(plStack_28);
  }
  else {
    ctx = (ly_ctx *)lyd_node_module(plStack_28);
    plStack_28 = plStack_28->child;
  }
  do {
    last_parsed = 0;
    for (last_match = plStack_28; last_match != (lyd_node *)0x0; last_match = last_match->next) {
      plVar3 = lys_parent(last_match->schema);
      if (plVar3 != (lys_node *)0x0) {
        if ((parsed_local._4_4_ & 4) == 0) {
          plVar3 = lys_parent(last_match->schema);
          if (plVar3->nodetype == LYS_OUTPUT) {
            pLVar4 = ly_errno_location();
            *pLVar4 = LY_EINVAL;
            ly_log(LY_LLERR,"Provided data tree includes some RPC output nodes (%s).",
                   last_match->schema->name);
            module_name[0] = -1;
            module_name[1] = -1;
            module_name[2] = -1;
            module_name[3] = -1;
            return (lyd_node *)0x0;
          }
        }
        else {
          plVar3 = lys_parent(last_match->schema);
          if (plVar3->nodetype == LYS_INPUT) {
            pLVar4 = ly_errno_location();
            *pLVar4 = LY_EINVAL;
            ly_log(LY_LLERR,"Provided data tree includes some RPC input nodes (%s).",
                   last_match->schema->name);
            module_name[0] = -1;
            module_name[1] = -1;
            module_name[2] = -1;
            module_name[3] = -1;
            return (lyd_node *)0x0;
          }
        }
      }
      iVar2 = strncmp(pred_name,last_match->schema->name,(long)list_instance_position);
      if ((iVar2 == 0) && (last_match->schema->name[list_instance_position] == '\0')) {
        if (name == (char *)0x0) {
          prev_mod = (lys_module *)ctx;
        }
        else {
          if (0x3ff < is_relative) {
            pLVar4 = ly_errno_location();
            *pLVar4 = LY_EINT;
            ly_log(LY_LLERR,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                   ,0x929);
            module_name[0] = -1;
            module_name[1] = -1;
            module_name[2] = -1;
            module_name[3] = -1;
            return (lyd_node *)0x0;
          }
          puVar5 = ly_buf_used_location();
          if ((*puVar5 != '\0') && (*buf_backup != '\0')) {
            str = strndup(buf_backup,0x3ff);
          }
          puVar5 = ly_buf_used_location();
          *puVar5 = *puVar5 + '\x01';
          memmove(buf_backup,name,(long)is_relative);
          buf_backup[is_relative] = '\0';
          prev_mod = ly_ctx_get_module(ctx_00,buf_backup,(char *)0x0);
          if (str != (char *)0x0) {
            strncpy(buf_backup,str,0x3ff);
            free(str);
            str = (char *)0x0;
          }
          puVar5 = ly_buf_used_location();
          *puVar5 = *puVar5 + 0xff;
          if (prev_mod == (lys_module *)0x0) {
            id = strndup(llist_value_local,
                         (size_t)(name + ((long)is_relative - (long)llist_value_local)));
            ly_vlog(LYE_PATH_INMOD,LY_VLOG_STR,id);
            free(id);
            module_name[0] = -1;
            module_name[1] = -1;
            module_name[2] = -1;
            module_name[3] = -1;
            return (lyd_node *)0x0;
          }
        }
        plVar6 = lyd_node_module(last_match);
        if (prev_mod == plVar6) {
          if (last_match->schema->nodetype == LYS_LEAFLIST) {
            sibling._4_4_ = 0;
            if (llval_len == 0) {
              mod_name_len = 0;
              if (start_local != (lyd_node *)0x0) {
                sVar7 = strlen((char *)start_local);
                last_has_pred = (int)sVar7;
              }
            }
            else {
              mod_name_len = parse_schema_json_predicate
                                       (mod_name,&data_val,&local_a0,(char **)&start_local,
                                        &last_has_pred,(int *)((long)&sibling + 4));
              if (mod_name_len < 1) {
                ly_vlog(LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,(ulong)(uint)(int)*mod_name,
                        mod_name);
                module_name[0] = -1;
                module_name[1] = -1;
                module_name[2] = -1;
                module_name[3] = -1;
                return (lyd_node *)0x0;
              }
              if ((*data_val != '.') || (local_a0 != 1)) {
                ly_vlog(LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,(ulong)(uint)(int)mod_name[1],
                        mod_name + 1);
                module_name[0] = -1;
                module_name[1] = -1;
                module_name[2] = -1;
                module_name[3] = -1;
                return (lyd_node *)0x0;
              }
            }
            if ((*(ushort *)&last_match[1].validity & 7) == 0) {
LAB_0011911f:
              _ret = last_match->child;
            }
            else {
              plVar1 = last_match->child;
              plVar6 = lyd_node_module(last_match);
              __s2 = plVar6->name;
              plVar6 = lyd_node_module(last_match);
              sVar7 = strlen(plVar6->name);
              iVar2 = strncmp((char *)plVar1,__s2,sVar7);
              if (iVar2 != 0) goto LAB_0011911f;
              plVar1 = last_match->child;
              plVar6 = lyd_node_module(last_match);
              sVar7 = strlen(plVar6->name);
              if (*(char *)((long)&plVar1->schema + sVar7) != ':') goto LAB_0011911f;
              plVar1 = last_match->child;
              plVar6 = lyd_node_module(last_match);
              sVar7 = strlen(plVar6->name);
              _ret = (lyd_node *)((long)&plVar1->schema + sVar7 + 1);
            }
            if ((((start_local == (lyd_node *)0x0) && (_ret != (lyd_node *)0x0)) &&
                (*(char *)&_ret->schema != '\0')) ||
               ((start_local != (lyd_node *)0x0 &&
                ((iVar2 = strncmp((char *)start_local,(char *)_ret,(long)last_has_pred), iVar2 != 0
                 || (*(char *)((long)&_ret->schema + (long)last_has_pred) != '\0'))))))
            goto LAB_00119308;
            mod_name = mod_name + mod_name_len;
            pred_name_len = mod_name_len + pred_name_len;
            llval_len = sibling._4_4_;
          }
          else if (last_match->schema->nodetype == LYS_LIST) {
            if (llval_len == 0) {
              return (lyd_node *)llist;
            }
            last_parsed = last_parsed + 1;
            mod_name_len = 0;
            nam_len = resolve_partial_json_data_list_predicate
                                (mod_name,pred_name,last_match,last_parsed,&mod_name_len);
            if (nam_len == -1) {
              module_name[0] = -1;
              module_name[1] = -1;
              module_name[2] = -1;
              module_name[3] = -1;
              return (lyd_node *)0x0;
            }
            if (nam_len == 1) goto LAB_00119308;
            mod_name = mod_name + mod_name_len;
            pred_name_len = mod_name_len + pred_name_len;
          }
          *(int *)module_name = pred_name_len + *(int *)module_name;
          if (*mod_name == '\0') {
            return last_match;
          }
          if ((last_match->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
            ly_vlog(LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,(ulong)(uint)(int)*mod_name,mod_name);
            module_name[0] = -1;
            module_name[1] = -1;
            module_name[2] = -1;
            module_name[3] = -1;
            return (lyd_node *)0x0;
          }
          llist = (lyd_node_leaf_list *)last_match;
          ctx = (ly_ctx *)lyd_node_module(last_match);
          plStack_28 = last_match->child;
          break;
        }
      }
LAB_00119308:
    }
    if (last_match == (lyd_node *)0x0) {
      return (lyd_node *)llist;
    }
    mod_name_len = parse_schema_nodeid(mod_name,&name,&is_relative,&pred_name,
                                       &list_instance_position,&has_predicate,&llval_len);
    if (mod_name_len < 1) {
      ly_vlog(LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,(ulong)(uint)(int)mod_name[-mod_name_len],
              mod_name + -mod_name_len);
      module_name[0] = -1;
      module_name[1] = -1;
      module_name[2] = -1;
      module_name[3] = -1;
      return (lyd_node *)0x0;
    }
    mod_name = mod_name + mod_name_len;
    pred_name_len = mod_name_len;
  } while( true );
}

Assistant:

struct lyd_node *
resolve_partial_json_data_nodeid(const char *nodeid, const char *llist_value, struct lyd_node *start, int options,
                                 int *parsed)
{
    char *module_name = ly_buf(), *buf_backup = NULL, *str;
    const char *id, *mod_name, *name, *pred_name, *data_val;
    int r, ret, mod_name_len, nam_len, is_relative = -1, list_instance_position;
    int has_predicate, last_parsed, llval_len, pred_name_len, last_has_pred;
    struct lyd_node *sibling, *last_match = NULL;
    struct lyd_node_leaf_list *llist;
    const struct lys_module *prefix_mod, *prev_mod;
    struct ly_ctx *ctx;

    assert(nodeid && start && parsed);

    ctx = start->schema->module->ctx;
    id = nodeid;

    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate)) < 1) {
        LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        *parsed = -1;
        return NULL;
    }
    id += r;
    /* add it to parsed only after the data node was actually found */
    last_parsed = r;

    if (is_relative) {
        prev_mod = lyd_node_module(start);
        start = start->child;
    } else {
        for (; start->parent; start = start->parent);
        prev_mod = lyd_node_module(start);
    }

    while (1) {
        list_instance_position = 0;

        LY_TREE_FOR(start, sibling) {
            /* RPC/action data check, return simply invalid argument, because the data tree is invalid */
            if (lys_parent(sibling->schema)) {
                if (options & LYD_PATH_OPT_OUTPUT) {
                    if (lys_parent(sibling->schema)->nodetype == LYS_INPUT) {
                        LOGERR(LY_EINVAL, "Provided data tree includes some RPC input nodes (%s).", sibling->schema->name);
                        *parsed = -1;
                        return NULL;
                    }
                } else {
                    if (lys_parent(sibling->schema)->nodetype == LYS_OUTPUT) {
                        LOGERR(LY_EINVAL, "Provided data tree includes some RPC output nodes (%s).", sibling->schema->name);
                        *parsed = -1;
                        return NULL;
                    }
                }
            }

            /* name match */
            if (!strncmp(name, sibling->schema->name, nam_len) && !sibling->schema->name[nam_len]) {

                /* module check */
                if (mod_name) {
                    if (mod_name_len > LY_BUF_SIZE - 1) {
                        LOGINT;
                        *parsed = -1;
                        return NULL;
                    }

                    if (ly_buf_used && module_name[0]) {
                        buf_backup = strndup(module_name, LY_BUF_SIZE - 1);
                    }
                    ly_buf_used++;

                    memmove(module_name, mod_name, mod_name_len);
                    module_name[mod_name_len] = '\0';
                    /* will also find an augment module */
                    prefix_mod = ly_ctx_get_module(ctx, module_name, NULL);

                    if (buf_backup) {
                        /* return previous internal buffer content */
                        strncpy(module_name, buf_backup, LY_BUF_SIZE - 1);
                        free(buf_backup);
                        buf_backup = NULL;
                    }
                    ly_buf_used--;

                    if (!prefix_mod) {
                        str = strndup(nodeid, (mod_name + mod_name_len) - nodeid);
                        LOGVAL(LYE_PATH_INMOD, LY_VLOG_STR, str);
                        free(str);
                        *parsed = -1;
                        return NULL;
                    }
                } else {
                    prefix_mod = prev_mod;
                }
                if (prefix_mod != lyd_node_module(sibling)) {
                    continue;
                }

                /* leaf-list, did we find it with the correct value or not? */
                if (sibling->schema->nodetype == LYS_LEAFLIST) {
                    llist = (struct lyd_node_leaf_list *)sibling;

                    last_has_pred = 0;
                    if (has_predicate) {
                        if ((r = parse_schema_json_predicate(id, &pred_name, &pred_name_len, &llist_value, &llval_len, &last_has_pred)) < 1) {
                            LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                            *parsed = -1;
                            return NULL;
                        }
                        if ((pred_name[0] != '.') || (pred_name_len != 1)) {
                            LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[1], id + 1);
                            *parsed = -1;
                            return NULL;
                        }
                    } else {
                        r = 0;
                        if (llist_value) {
                            llval_len = strlen(llist_value);
                        }
                    }

                    /* make value canonical */
                    if ((llist->value_type & LY_TYPE_IDENT)
                            && !strncmp(llist->value_str, lyd_node_module(sibling)->name, strlen(lyd_node_module(sibling)->name))
                            && (llist->value_str[strlen(lyd_node_module(sibling)->name)] == ':')) {
                        data_val = llist->value_str + strlen(lyd_node_module(sibling)->name) + 1;
                    } else {
                        data_val = llist->value_str;
                    }

                    if ((!llist_value && data_val && data_val[0])
                            || (llist_value && (strncmp(llist_value, data_val, llval_len) || data_val[llval_len]))) {
                        continue;
                    }

                    id += r;
                    last_parsed += r;
                    has_predicate = last_has_pred;

                } else if (sibling->schema->nodetype == LYS_LIST) {
                    /* list, we likely need predicates'n'stuff then, but if without a predicate, we are always creating it */
                    if (!has_predicate) {
                        /* none match */
                        return last_match;
                    }

                    ++list_instance_position;
                    r = 0;
                    ret = resolve_partial_json_data_list_predicate(id, name, sibling, list_instance_position, &r);
                    if (ret == -1) {
                        *parsed = -1;
                        return NULL;
                    } else if (ret == 1) {
                        /* this list instance does not match */
                        continue;
                    }
                    id += r;
                    last_parsed += r;
                }

                *parsed += last_parsed;

                /* the result node? */
                if (!id[0]) {
                    return sibling;
                }

                /* move down the tree, if possible */
                if (sibling->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
                    LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                    *parsed = -1;
                    return NULL;
                }
                last_match = sibling;
                prev_mod = lyd_node_module(sibling);
                start = sibling->child;
                break;
            }
        }

        /* no match, return last match */
        if (!sibling) {
            return last_match;
        }

        if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate)) < 1) {
            LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
            *parsed = -1;
            return NULL;
        }
        id += r;
        last_parsed = r;
    }

    /* cannot get here */
    LOGINT;
    *parsed = -1;
    return NULL;
}